

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  type this;
  rep rVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  time_point end;
  ColorRefinementAmenability cra;
  Graph g;
  iterator __end1;
  iterator __begin1;
  GraphDatabase *__range1;
  time_point start;
  double num_is_amenable;
  GraphDatabase graph_data_base;
  string *in_stack_000008d8;
  ColorRefinementAmenability *in_stack_00000a28;
  Graph *in_stack_fffffffffffffe98;
  Graph *in_stack_fffffffffffffea0;
  Graph *in_stack_fffffffffffffea8;
  Graph *in_stack_fffffffffffffeb0;
  duration<double,_std::ratio<1L,_1L>_> local_110;
  undefined8 local_108;
  Graph *local_80;
  __normal_iterator<GraphLibrary::Graph_*,_std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>_>
  local_78;
  vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *local_70;
  undefined8 local_68;
  double local_60;
  allocator local_41;
  string local_40 [32];
  vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> local_20;
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"NCI1",&local_41);
  AuxiliaryMethods::read_graph_txt_file(in_stack_000008d8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  poVar3 = std::operator<<((ostream *)&std::cout,"Graph data base loaded.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_60 = 0.0;
  local_68 = std::chrono::_V2::system_clock::now();
  local_70 = &local_20;
  local_78._M_current =
       (Graph *)std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::begin
                          (in_stack_fffffffffffffe98);
  local_80 = (Graph *)std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::end
                                ((vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                                  *)in_stack_fffffffffffffe98);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<GraphLibrary::Graph_*,_std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<GraphLibrary::Graph_*,_std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>_>
                             *)in_stack_fffffffffffffe98), bVar2) {
    __gnu_cxx::
    __normal_iterator<GraphLibrary::Graph_*,_std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>_>
    ::operator*(&local_78);
    GraphLibrary::Graph::Graph(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    ColorRefinementAmenability::ColorRefinementAmenability::ColorRefinementAmenability
              ((ColorRefinementAmenability *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar2 = ColorRefinementAmenability::ColorRefinementAmenability::check_amenability
                      (in_stack_00000a28);
    if (bVar2) {
      local_60 = local_60 + 1.0;
    }
    ColorRefinementAmenability::ColorRefinementAmenability::~ColorRefinementAmenability
              ((ColorRefinementAmenability *)0x10273f);
    GraphLibrary::Graph::~Graph(in_stack_fffffffffffffea0);
    __gnu_cxx::
    __normal_iterator<GraphLibrary::Graph_*,_std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>_>
    ::operator++(&local_78);
  }
  local_108 = std::chrono::_V2::system_clock::now();
  dVar1 = local_60;
  sVar4 = std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::size(&local_20);
  auVar6._8_4_ = (int)(sVar4 >> 0x20);
  auVar6._0_8_ = sVar4;
  auVar6._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (dVar1 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) *
                      100.0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Running time [s]: ");
  this = std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffea8,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffea0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffea8);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_110);
  sVar4 = std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::size(&local_20);
  auVar7._8_4_ = (int)(sVar4 >> 0x20);
  auVar7._0_8_ = sVar4;
  auVar7._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,rVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))
                     );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::~vector
            ((vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *)this.__r);
  return local_4;
}

Assistant:

int main() {
    GraphDatabase graph_data_base = AuxiliaryMethods::read_graph_txt_file("NCI1");
    cout << "Graph data base loaded." << endl;

    double num_is_amenable = 0;
    auto start = chrono::high_resolution_clock::now();
    for (const auto g: graph_data_base) {
        ColorRefinementAmenability::ColorRefinementAmenability cra(g);
        if (cra.check_amenability()) {
            num_is_amenable += 1;
        }
    }
    auto end = chrono::high_resolution_clock::now();

    cout << num_is_amenable / graph_data_base.size() * 100.0 << endl;
    cout << "Running time [s]: " << chrono::duration<double>(end - start).count() / graph_data_base.size() << endl;

    return 0;
}